

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::DescriptorProto::~DescriptorProto(DescriptorProto *this)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  DescriptorProto *in_stack_00000060;
  
  (in_RDI->super_RepeatedPtrFieldBase).arena_ = (Arena *)&PTR__DescriptorProto_00967330;
  SharedDtor(in_stack_00000060);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~RepeatedPtrField(in_RDI);
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::~RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *)in_RDI);
  RepeatedPtrField<google::protobuf::OneofDescriptorProto>::~RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::OneofDescriptorProto> *)in_RDI);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::~RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)in_RDI);
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::~RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *)in_RDI);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::~RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::EnumDescriptorProto> *)in_RDI);
  RepeatedPtrField<google::protobuf::DescriptorProto>::~RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::DescriptorProto> *)in_RDI);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::~RepeatedPtrField
            ((RepeatedPtrField<google::protobuf::FieldDescriptorProto> *)in_RDI);
  internal::InternalMetadataWithArena::~InternalMetadataWithArena
            ((InternalMetadataWithArena *)0x51221b);
  Message::~Message((Message *)0x512225);
  return;
}

Assistant:

DescriptorProto::~DescriptorProto() {
  // @@protoc_insertion_point(destructor:google.protobuf.DescriptorProto)
  SharedDtor();
}